

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpConnector.c
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  void *__arg;
  long lVar3;
  sbfThread t;
  undefined2 local_88;
  undefined1 local_86 [106];
  undefined4 local_1c;
  
  uVar1 = sbfLog_create(0,"sbf");
  sbfLog_setLevel(uVar1,4);
  uVar2 = sbfKeyValue_create();
  uVar2 = sbfMw_create(uVar1,uVar2);
  __arg = (void *)sbfQueue_create(uVar2);
  pthread_create(&t,(pthread_attr_t *)0x0,dispatchCb,__arg);
  local_1c = 0;
  local_88 = 1;
  memcpy(local_86,"/tmp/test.sock",0x6b);
  uVar2 = sbfMw_getThread(uVar2,0);
  lVar3 = sbfTcpConnection_create
                    (uVar1,uVar2,__arg,&local_88,1,0,onConnectionReady,onConnectionError,
                     onConnectionRead,0);
  if (lVar3 == 0) {
    fwrite("failed to create connection to real time host",0x2d,1,_stderr);
  }
  else {
    sleep(10);
  }
  exit(0);
}

Assistant:

int
main (int argc, char** argv)
{
    sbfMw               mw;
    sbfQueue            queue;
    sbfThread           t;
    sbfKeyValue         properties;
    sbfLog              log;
    sbfTcpConnection    connection;

    log = sbfLog_create (NULL, "sbf");
    sbfLog_setLevel (log, SBF_LOG_OFF);

    properties = sbfKeyValue_create ();
    mw = sbfMw_create (log, properties);

    queue = sbfQueue_create (mw, "default");
    sbfThread_create (&t, dispatchCb, queue);

    sbfTcpConnectionAddress address;
    memset(&address, 0, sizeof(address));
    address.sun.sun_family = AF_UNIX;
    strncpy(address.sun.sun_path, "/tmp/test.sock", sizeof(address.sun.sun_path) - 1);
    int isUnix = 1;
    
    connection = sbfTcpConnection_create (log,
                                          sbfMw_getDefaultThread (mw),
                                          queue,
                                          &address,
                                          isUnix,
                                          0,
                                          onConnectionReady,
                                          onConnectionError,
                                          onConnectionRead,
                                          NULL);
    if (connection == NULL)
    {
        fprintf (stderr, "failed to create connection to real time host");
    }
    else
    {
        sleep(10);
    }
    
    exit (0);
}